

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::LRN_x86_avx512::forward_inplace(LRN_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  int *piVar34;
  pointer piVar35;
  Mat *pMVar36;
  _func_int **pp_Var37;
  Mat *pMVar38;
  int k;
  uint uVar39;
  _func_int *p_Var40;
  Mat *pMVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  int j;
  _func_int ***ppp_Var45;
  long lVar46;
  int iVar47;
  undefined1 (*pauVar48) [32];
  int iVar49;
  long lVar50;
  float *pfVar51;
  _func_int ***ppp_Var52;
  int iVar53;
  uint uVar54;
  int iVar55;
  void *pvVar56;
  int q;
  uint uVar57;
  int iVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  allocator_type local_199;
  Mat *local_198;
  LRN_x86_avx512 *local_190;
  Mat local_188;
  Mat *local_140;
  _func_int ***local_138;
  Mat *local_130;
  undefined1 local_128 [16];
  Mat local_118;
  Allocator *local_d0;
  long local_c8;
  long local_c0;
  void *local_b8;
  Mat *local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  undefined1 auVar64 [32];
  undefined1 auVar67 [32];
  
  uVar39 = bottom_top_blob->w;
  local_198 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  uVar54 = bottom_top_blob->c;
  sVar2 = bottom_top_blob->elemsize;
  local_118.cstep = 0;
  local_118.data = (Allocator *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)local_118.data;
  local_118.dims = (int)local_118.refcount;
  local_118.w = local_118.refcount._4_4_;
  local_118._48_8_ = local_118.elemsize;
  local_118.c = local_118.elempack;
  Mat::create(&local_118,uVar39,bottom_top_blob->h,uVar54,sVar2,opt->workspace_allocator);
  iVar53 = -100;
  if (((Allocator *)local_118.data == (Allocator *)0x0) ||
     ((long)local_118.c * local_118.cstep == 0)) goto LAB_003093ee;
  local_98._0_8_ = sVar2;
  local_128._0_8_ = opt;
  local_a0 = (long)(int)uVar39;
  iVar53 = (int)local_198 * uVar39;
  pMVar36 = (Mat *)0x0;
  local_140 = (Mat *)0x0;
  if (0 < (int)uVar54) {
    local_140 = (Mat *)(ulong)uVar54;
  }
  for (; pMVar36 != local_140; pMVar36 = (Mat *)((long)&pMVar36->data + 1)) {
    pvVar56 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pfVar51 = (float *)(sVar4 * (long)pMVar36 * sVar3 + (long)pvVar56);
    ppp_Var45 = (_func_int ***)
                ((long)(_func_int ***)local_118.data +
                local_118.cstep * (long)pMVar36 * local_118.elemsize);
    lVar46 = 0;
    for (iVar55 = 0; iVar55 + 7 < iVar53; iVar55 = iVar55 + 8) {
      auVar61._4_4_ = pfVar51[1] * pfVar51[1];
      auVar61._0_4_ = *pfVar51 * *pfVar51;
      auVar61._8_4_ = pfVar51[2] * pfVar51[2];
      auVar61._12_4_ = pfVar51[3] * pfVar51[3];
      auVar61._16_4_ = pfVar51[4] * pfVar51[4];
      auVar61._20_4_ = pfVar51[5] * pfVar51[5];
      auVar61._24_4_ = pfVar51[6] * pfVar51[6];
      auVar61._28_4_ = pfVar51[7];
      *(undefined1 (*) [32])ppp_Var45 = auVar61;
      pfVar51 = pfVar51 + 8;
      ppp_Var45 = ppp_Var45 + 4;
      lVar46 = lVar46 + 8;
    }
    for (; (int)lVar46 < iVar53; lVar46 = lVar46 + 1) {
      fVar68 = *(float *)((long)pvVar56 + lVar46 * 4 + sVar4 * sVar3 * (long)pMVar36);
      *(float *)((long)(_func_int ***)local_118.data +
                lVar46 * 4 + local_118.cstep * local_118.elemsize * (long)pMVar36) = fVar68 * fVar68
      ;
    }
  }
  pp_Var37 = this->_vptr_LRN_x86_avx512;
  local_190 = this;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var37[-3]) == 0) {
    local_188.cstep = 0;
    local_188.data = (Allocator *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    Mat::create(&local_188,uVar39,(int)local_198,uVar54,sVar2,opt->workspace_allocator);
    if (((Allocator *)local_188.data == (Allocator *)0x0) ||
       (local_188.cstep * (long)local_188.c == 0)) {
      piVar34 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
      iVar53 = -100;
      if (piVar34 == (int *)0x0) goto LAB_003093ee;
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 != 0) goto LAB_003093ee;
      if (local_188.allocator != (Allocator *)0x0) {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        goto LAB_003093ee;
      }
LAB_00309442:
      iVar53 = -100;
      free(local_188.data);
      goto LAB_003093ee;
    }
    uVar39 = (int)local_188.cstep * local_188.c;
    uVar43 = 0;
    uVar42 = (ulong)uVar39;
    if ((int)uVar39 < 1) {
      uVar42 = uVar43;
    }
    for (; (int)uVar42 != (int)uVar43; uVar43 = uVar43 + 1) {
      *(undefined4 *)((long)(_func_int ***)local_188.data + uVar43 * 4) = 0;
    }
    pp_Var37 = this->_vptr_LRN_x86_avx512;
    local_128._0_4_ =
         *(float *)(&this->field_0xd8 + (long)pp_Var37[-3]) /
         (float)*(int *)(&this->field_0xd4 + (long)pp_Var37[-3]);
    local_128._4_12_ = SUB6012((undefined1  [60])0x0,0);
    local_98._4_4_ = local_128._0_4_;
    local_98._0_4_ = local_128._0_4_;
    local_98._8_4_ = local_128._0_4_;
    local_98._12_4_ = local_128._0_4_;
    local_98._16_4_ = local_128._0_4_;
    local_98._20_4_ = local_128._0_4_;
    local_98._24_4_ = local_128._0_4_;
    local_98._28_4_ = local_128._0_4_;
    local_138 = (_func_int ***)CONCAT44(local_138._4_4_,uVar54);
    local_130 = bottom_top_blob;
    for (pMVar36 = (Mat *)0x0; pvVar56 = local_188.data, pMVar36 != local_140;
        pMVar36 = (Mat *)((long)&pMVar36->data + 1)) {
      p_Var40 = pp_Var37[-3];
      iVar55 = *(int *)(&this->field_0xd4 + (long)p_Var40);
      for (uVar39 = iVar55 / -2 + (int)pMVar36; (int)uVar39 <= iVar55 / 2 + (int)pMVar36;
          uVar39 = uVar39 + 1) {
        if ((int)uVar39 < (int)uVar54 && -1 < (int)uVar39) {
          ppp_Var52 = (_func_int ***)
                      ((long)(_func_int ***)local_118.data +
                      local_118.cstep * uVar39 * local_118.elemsize);
          lVar50 = local_188.cstep * (long)pMVar36 *
                   CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          ppp_Var45 = (_func_int ***)((long)(_func_int ***)local_188.data + lVar50);
          lVar46 = 0;
          for (iVar55 = 0; iVar55 + 7 < iVar53; iVar55 = iVar55 + 8) {
            auVar62._0_4_ = *(float *)ppp_Var45 + *(float *)ppp_Var52;
            auVar62._4_4_ = *(float *)((long)ppp_Var45 + 4) + *(float *)((long)ppp_Var52 + 4);
            auVar62._8_4_ = *(float *)(ppp_Var45 + 1) + *(float *)(ppp_Var52 + 1);
            auVar62._12_4_ =
                 *(float *)((long)(ppp_Var45 + 1) + 4) + *(float *)((long)(ppp_Var52 + 1) + 4);
            auVar62._16_4_ = *(float *)(ppp_Var45 + 2) + *(float *)(ppp_Var52 + 2);
            auVar62._20_4_ =
                 *(float *)((long)(ppp_Var45 + 2) + 4) + *(float *)((long)(ppp_Var52 + 2) + 4);
            auVar62._24_4_ = *(float *)(ppp_Var45 + 3) + *(float *)(ppp_Var52 + 3);
            auVar62._28_4_ =
                 *(float *)((long)(ppp_Var45 + 3) + 4) + *(float *)((long)(ppp_Var52 + 3) + 4);
            *(undefined1 (*) [32])ppp_Var45 = auVar62;
            ppp_Var52 = ppp_Var52 + 4;
            ppp_Var45 = ppp_Var45 + 4;
            lVar46 = lVar46 + 8;
          }
          for (; (int)lVar46 < iVar53; lVar46 = lVar46 + 1) {
            *(float *)((long)(_func_int ***)local_188.data + lVar46 * 4 + lVar50) =
                 *(float *)((long)(_func_int ***)local_188.data + lVar46 * 4 + lVar50) +
                 *(float *)((long)(_func_int ***)local_118.data +
                           lVar46 * 4 + local_118.cstep * local_118.elemsize * (ulong)uVar39);
          }
          p_Var40 = pp_Var37[-3];
          iVar55 = *(int *)(&local_190->field_0xd4 + (long)p_Var40);
          this = local_190;
        }
      }
      pvVar5 = local_130->data;
      sVar2 = local_130->elemsize;
      sVar3 = local_130->cstep;
      pauVar48 = (undefined1 (*) [32])(sVar3 * (long)pMVar36 * sVar2 + (long)pvVar5);
      ppp_Var45 = (_func_int ***)
                  ((long)(_func_int ***)local_188.data +
                  local_188.cstep * (long)pMVar36 *
                  CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize));
      uVar1 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var40);
      auVar69._4_4_ = uVar1;
      auVar69._0_4_ = uVar1;
      auVar69._8_4_ = uVar1;
      auVar69._12_4_ = uVar1;
      auVar69._16_4_ = uVar1;
      auVar69._20_4_ = uVar1;
      auVar69._24_4_ = uVar1;
      auVar69._28_4_ = uVar1;
      auVar60._8_4_ = 0x80000000;
      auVar60._0_8_ = 0x8000000080000000;
      auVar60._12_4_ = 0x80000000;
      auVar60 = vxorps_avx512vl(ZEXT416(*(uint *)(&this->field_0xdc + (long)p_Var40)),auVar60);
      fVar68 = auVar60._0_4_;
      lVar46 = 0;
      for (iVar55 = 0; iVar55 + 7 < iVar53; iVar55 = iVar55 + 8) {
        auVar60 = vfmadd132ps_fma(*(undefined1 (*) [32])ppp_Var45,auVar69,local_98);
        uVar42 = vcmpps_avx512vl(ZEXT1632(auVar60),_DAT_004c96a0,2);
        auVar63._8_4_ = 0x800000;
        auVar63._0_8_ = 0x80000000800000;
        auVar63._12_4_ = 0x800000;
        auVar63._16_4_ = 0x800000;
        auVar63._20_4_ = 0x800000;
        auVar63._24_4_ = 0x800000;
        auVar63._28_4_ = 0x800000;
        auVar61 = vmaxps_avx512vl(ZEXT1632(auVar60),auVar63);
        auVar71 = vpsrld_avx2(auVar61,0x17);
        auVar72._8_4_ = 0x807fffff;
        auVar72._0_8_ = 0x807fffff807fffff;
        auVar72._12_4_ = 0x807fffff;
        auVar72._16_4_ = 0x807fffff;
        auVar72._20_4_ = 0x807fffff;
        auVar72._24_4_ = 0x807fffff;
        auVar72._28_4_ = 0x807fffff;
        auVar66._8_4_ = 0x3f000000;
        auVar66._0_8_ = 0x3f0000003f000000;
        auVar66._12_4_ = 0x3f000000;
        auVar66._16_4_ = 0x3f000000;
        auVar66._20_4_ = 0x3f000000;
        auVar66._24_4_ = 0x3f000000;
        auVar66._28_4_ = 0x3f000000;
        auVar61 = vpternlogd_avx512vl(auVar61,auVar72,auVar66,0xea);
        auVar11._8_4_ = 0x3f3504f3;
        auVar11._0_8_ = 0x3f3504f33f3504f3;
        auVar11._12_4_ = 0x3f3504f3;
        auVar11._16_4_ = 0x3f3504f3;
        auVar11._20_4_ = 0x3f3504f3;
        auVar11._24_4_ = 0x3f3504f3;
        auVar11._28_4_ = 0x3f3504f3;
        uVar43 = vcmpps_avx512vl(auVar61,auVar11,1);
        auVar12._8_4_ = 0xbf800000;
        auVar12._0_8_ = 0xbf800000bf800000;
        auVar12._12_4_ = 0xbf800000;
        auVar12._16_4_ = 0xbf800000;
        auVar12._20_4_ = 0xbf800000;
        auVar12._24_4_ = 0xbf800000;
        auVar12._28_4_ = 0xbf800000;
        auVar62 = vaddps_avx512vl(auVar61,auVar12);
        auVar63 = vaddps_avx512vl(auVar62,auVar61);
        bVar6 = (bool)((byte)uVar43 & 1);
        auVar64._0_4_ = (float)((uint)bVar6 * auVar63._0_4_ | (uint)!bVar6 * auVar62._0_4_);
        bVar6 = (bool)((byte)(uVar43 >> 1) & 1);
        auVar64._4_4_ = (float)((uint)bVar6 * auVar63._4_4_ | (uint)!bVar6 * auVar62._4_4_);
        bVar6 = (bool)((byte)(uVar43 >> 2) & 1);
        auVar64._8_4_ = (float)((uint)bVar6 * auVar63._8_4_ | (uint)!bVar6 * auVar62._8_4_);
        bVar6 = (bool)((byte)(uVar43 >> 3) & 1);
        auVar64._12_4_ = (float)((uint)bVar6 * auVar63._12_4_ | (uint)!bVar6 * auVar62._12_4_);
        bVar6 = (bool)((byte)(uVar43 >> 4) & 1);
        auVar64._16_4_ = (float)((uint)bVar6 * auVar63._16_4_ | (uint)!bVar6 * auVar62._16_4_);
        bVar6 = (bool)((byte)(uVar43 >> 5) & 1);
        auVar64._20_4_ = (float)((uint)bVar6 * auVar63._20_4_ | (uint)!bVar6 * auVar62._20_4_);
        bVar6 = (bool)((byte)(uVar43 >> 6) & 1);
        auVar64._24_4_ = (float)((uint)bVar6 * auVar63._24_4_ | (uint)!bVar6 * auVar62._24_4_);
        bVar6 = SUB81(uVar43 >> 7,0);
        auVar64._28_4_ = (uint)bVar6 * auVar63._28_4_ | (uint)!bVar6 * auVar62._28_4_;
        auVar29._4_4_ = auVar64._4_4_ * auVar64._4_4_;
        auVar29._0_4_ = auVar64._0_4_ * auVar64._0_4_;
        auVar29._8_4_ = auVar64._8_4_ * auVar64._8_4_;
        auVar29._12_4_ = auVar64._12_4_ * auVar64._12_4_;
        auVar29._16_4_ = auVar64._16_4_ * auVar64._16_4_;
        auVar29._20_4_ = auVar64._20_4_ * auVar64._20_4_;
        auVar29._24_4_ = auVar64._24_4_ * auVar64._24_4_;
        auVar29._28_4_ = auVar61._28_4_;
        auVar73._8_4_ = 0x3d9021bb;
        auVar73._0_8_ = 0x3d9021bb3d9021bb;
        auVar73._12_4_ = 0x3d9021bb;
        auVar73._16_4_ = 0x3d9021bb;
        auVar73._20_4_ = 0x3d9021bb;
        auVar73._24_4_ = 0x3d9021bb;
        auVar73._28_4_ = 0x3d9021bb;
        auVar13._8_4_ = 0xbdebd1b8;
        auVar13._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar13._12_4_ = 0xbdebd1b8;
        auVar13._16_4_ = 0xbdebd1b8;
        auVar13._20_4_ = 0xbdebd1b8;
        auVar13._24_4_ = 0xbdebd1b8;
        auVar13._28_4_ = 0xbdebd1b8;
        auVar61 = vfmadd213ps_avx512vl(auVar73,auVar64,auVar13);
        auVar14._8_4_ = 0x3def251a;
        auVar14._0_8_ = 0x3def251a3def251a;
        auVar14._12_4_ = 0x3def251a;
        auVar14._16_4_ = 0x3def251a;
        auVar14._20_4_ = 0x3def251a;
        auVar14._24_4_ = 0x3def251a;
        auVar14._28_4_ = 0x3def251a;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar64,auVar14);
        auVar15._8_4_ = 0xbdfe5d4f;
        auVar15._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar15._12_4_ = 0xbdfe5d4f;
        auVar15._16_4_ = 0xbdfe5d4f;
        auVar15._20_4_ = 0xbdfe5d4f;
        auVar15._24_4_ = 0xbdfe5d4f;
        auVar15._28_4_ = 0xbdfe5d4f;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar64,auVar15);
        auVar16._8_4_ = 0x3e11e9bf;
        auVar16._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar16._12_4_ = 0x3e11e9bf;
        auVar16._16_4_ = 0x3e11e9bf;
        auVar16._20_4_ = 0x3e11e9bf;
        auVar16._24_4_ = 0x3e11e9bf;
        auVar16._28_4_ = 0x3e11e9bf;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar64,auVar16);
        auVar17._8_4_ = 0xbe2aae50;
        auVar17._0_8_ = 0xbe2aae50be2aae50;
        auVar17._12_4_ = 0xbe2aae50;
        auVar17._16_4_ = 0xbe2aae50;
        auVar17._20_4_ = 0xbe2aae50;
        auVar17._24_4_ = 0xbe2aae50;
        auVar17._28_4_ = 0xbe2aae50;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar64,auVar17);
        auVar18._8_4_ = 0x3e4cceac;
        auVar18._0_8_ = 0x3e4cceac3e4cceac;
        auVar18._12_4_ = 0x3e4cceac;
        auVar18._16_4_ = 0x3e4cceac;
        auVar18._20_4_ = 0x3e4cceac;
        auVar18._24_4_ = 0x3e4cceac;
        auVar18._28_4_ = 0x3e4cceac;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar64,auVar18);
        auVar19._8_4_ = 0xbe7ffffc;
        auVar19._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar19._12_4_ = 0xbe7ffffc;
        auVar19._16_4_ = 0xbe7ffffc;
        auVar19._20_4_ = 0xbe7ffffc;
        auVar19._24_4_ = 0xbe7ffffc;
        auVar19._28_4_ = 0xbe7ffffc;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar64,auVar19);
        auVar20._8_4_ = 0x3eaaaaaa;
        auVar20._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar20._12_4_ = 0x3eaaaaaa;
        auVar20._16_4_ = 0x3eaaaaaa;
        auVar20._20_4_ = 0x3eaaaaaa;
        auVar20._24_4_ = 0x3eaaaaaa;
        auVar20._28_4_ = 0x3eaaaaaa;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar64,auVar20);
        auVar30._4_4_ = auVar64._4_4_ * auVar64._4_4_ * auVar64._4_4_ * auVar61._4_4_;
        auVar30._0_4_ = auVar64._0_4_ * auVar64._0_4_ * auVar64._0_4_ * auVar61._0_4_;
        auVar30._8_4_ = auVar64._8_4_ * auVar64._8_4_ * auVar64._8_4_ * auVar61._8_4_;
        auVar30._12_4_ = auVar64._12_4_ * auVar64._12_4_ * auVar64._12_4_ * auVar61._12_4_;
        auVar30._16_4_ = auVar64._16_4_ * auVar64._16_4_ * auVar64._16_4_ * auVar61._16_4_;
        auVar30._20_4_ = auVar64._20_4_ * auVar64._20_4_ * auVar64._20_4_ * auVar61._20_4_;
        auVar30._24_4_ = auVar64._24_4_ * auVar64._24_4_ * auVar64._24_4_ * auVar61._24_4_;
        auVar30._28_4_ = auVar61._28_4_;
        auVar21._8_4_ = 0xffffff82;
        auVar21._0_8_ = 0xffffff82ffffff82;
        auVar21._12_4_ = 0xffffff82;
        auVar21._16_4_ = 0xffffff82;
        auVar21._20_4_ = 0xffffff82;
        auVar21._24_4_ = 0xffffff82;
        auVar21._28_4_ = 0xffffff82;
        auVar61 = vpaddd_avx512vl(auVar71,auVar21);
        auVar61 = vcvtdq2ps_avx(auVar61);
        auVar76._8_4_ = 0x3f800000;
        auVar76._0_8_ = 0x3f8000003f800000;
        auVar76._12_4_ = 0x3f800000;
        auVar76._16_4_ = 0x3f800000;
        auVar76._20_4_ = 0x3f800000;
        auVar76._24_4_ = 0x3f800000;
        auVar76._28_4_ = 0x3f800000;
        auVar62 = vsubps_avx512vl(auVar61,auVar76);
        bVar6 = (bool)((byte)uVar43 & 1);
        auVar65._0_4_ = (uint)bVar6 * auVar62._0_4_ | (uint)!bVar6 * auVar61._0_4_;
        bVar6 = (bool)((byte)(uVar43 >> 1) & 1);
        auVar65._4_4_ = (uint)bVar6 * auVar62._4_4_ | (uint)!bVar6 * auVar61._4_4_;
        bVar6 = (bool)((byte)(uVar43 >> 2) & 1);
        auVar65._8_4_ = (uint)bVar6 * auVar62._8_4_ | (uint)!bVar6 * auVar61._8_4_;
        bVar6 = (bool)((byte)(uVar43 >> 3) & 1);
        auVar65._12_4_ = (uint)bVar6 * auVar62._12_4_ | (uint)!bVar6 * auVar61._12_4_;
        bVar6 = (bool)((byte)(uVar43 >> 4) & 1);
        auVar65._16_4_ = (uint)bVar6 * auVar62._16_4_ | (uint)!bVar6 * auVar61._16_4_;
        bVar6 = (bool)((byte)(uVar43 >> 5) & 1);
        auVar65._20_4_ = (uint)bVar6 * auVar62._20_4_ | (uint)!bVar6 * auVar61._20_4_;
        bVar6 = (bool)((byte)(uVar43 >> 6) & 1);
        auVar65._24_4_ = (uint)bVar6 * auVar62._24_4_ | (uint)!bVar6 * auVar61._24_4_;
        bVar6 = SUB81(uVar43 >> 7,0);
        auVar65._28_4_ = (uint)bVar6 * auVar62._28_4_ | (uint)!bVar6 * auVar61._28_4_;
        auVar77._8_4_ = 0xb95e8083;
        auVar77._0_8_ = 0xb95e8083b95e8083;
        auVar77._12_4_ = 0xb95e8083;
        auVar77._16_4_ = 0xb95e8083;
        auVar77._20_4_ = 0xb95e8083;
        auVar77._24_4_ = 0xb95e8083;
        auVar77._28_4_ = 0xb95e8083;
        auVar60 = vfmadd231ps_fma(auVar30,auVar65,auVar77);
        auVar78._8_4_ = 0x3f000000;
        auVar78._0_8_ = 0x3f0000003f000000;
        auVar78._12_4_ = 0x3f000000;
        auVar78._16_4_ = 0x3f000000;
        auVar78._20_4_ = 0x3f000000;
        auVar78._24_4_ = 0x3f000000;
        auVar78._28_4_ = 0x3f000000;
        auVar60 = vfmsub231ps_fma(ZEXT1632(auVar60),auVar78,auVar29);
        auVar61 = vsubps_avx(ZEXT1632(auVar60),auVar64);
        auVar74._8_4_ = 0x3f318000;
        auVar74._0_8_ = 0x3f3180003f318000;
        auVar74._12_4_ = 0x3f318000;
        auVar74._16_4_ = 0x3f318000;
        auVar74._20_4_ = 0x3f318000;
        auVar74._24_4_ = 0x3f318000;
        auVar74._28_4_ = 0x3f318000;
        auVar60 = vfmsub231ps_fma(auVar61,auVar74,auVar65);
        auVar61 = vpcmpeqd_avx2(auVar65,auVar65);
        bVar6 = (bool)((byte)uVar42 & 1);
        bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar42 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar42 >> 3) & 1);
        auVar31._4_4_ = (float)((uint)bVar7 * auVar61._4_4_ | (uint)!bVar7 * auVar60._4_4_) * fVar68
        ;
        auVar31._0_4_ = (float)((uint)bVar6 * auVar61._0_4_ | (uint)!bVar6 * auVar60._0_4_) * fVar68
        ;
        auVar31._8_4_ = (float)((uint)bVar8 * auVar61._8_4_ | (uint)!bVar8 * auVar60._8_4_) * fVar68
        ;
        auVar31._12_4_ =
             (float)((uint)bVar9 * auVar61._12_4_ | (uint)!bVar9 * auVar60._12_4_) * fVar68;
        auVar31._16_4_ = (float)((uint)((byte)(uVar42 >> 4) & 1) * auVar61._16_4_) * fVar68;
        auVar31._20_4_ = (float)((uint)((byte)(uVar42 >> 5) & 1) * auVar61._20_4_) * fVar68;
        auVar31._24_4_ = (float)((uint)((byte)(uVar42 >> 6) & 1) * auVar61._24_4_) * fVar68;
        auVar31._28_4_ = (uint)(byte)(uVar42 >> 7) * auVar61._28_4_;
        auVar71._8_4_ = 0x42b0c0a5;
        auVar71._0_8_ = 0x42b0c0a542b0c0a5;
        auVar71._12_4_ = 0x42b0c0a5;
        auVar71._16_4_ = 0x42b0c0a5;
        auVar71._20_4_ = 0x42b0c0a5;
        auVar71._24_4_ = 0x42b0c0a5;
        auVar71._28_4_ = 0x42b0c0a5;
        auVar61 = vminps_avx512vl(auVar31,auVar71);
        auVar22._8_4_ = 0xc2b0c0a5;
        auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar22._12_4_ = 0xc2b0c0a5;
        auVar22._16_4_ = 0xc2b0c0a5;
        auVar22._20_4_ = 0xc2b0c0a5;
        auVar22._24_4_ = 0xc2b0c0a5;
        auVar22._28_4_ = 0xc2b0c0a5;
        auVar62 = vmaxps_avx512vl(auVar61,auVar22);
        auVar23._8_4_ = 0x3fb8aa3b;
        auVar23._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar23._12_4_ = 0x3fb8aa3b;
        auVar23._16_4_ = 0x3fb8aa3b;
        auVar23._20_4_ = 0x3fb8aa3b;
        auVar23._24_4_ = 0x3fb8aa3b;
        auVar23._28_4_ = 0x3fb8aa3b;
        auVar63 = vfmadd231ps_avx512vl(auVar78,auVar62,auVar23);
        auVar61 = vroundps_avx(auVar63,1);
        uVar42 = vcmpps_avx512vl(auVar63,auVar61,1);
        auVar66 = vsubps_avx512vl(auVar61,auVar76);
        bVar6 = (bool)((byte)uVar42 & 1);
        auVar67._0_4_ = (float)((uint)bVar6 * auVar66._0_4_ | (uint)!bVar6 * auVar61._0_4_);
        bVar6 = (bool)((byte)(uVar42 >> 1) & 1);
        auVar67._4_4_ = (float)((uint)bVar6 * auVar66._4_4_ | (uint)!bVar6 * auVar61._4_4_);
        bVar6 = (bool)((byte)(uVar42 >> 2) & 1);
        auVar67._8_4_ = (float)((uint)bVar6 * auVar66._8_4_ | (uint)!bVar6 * auVar61._8_4_);
        bVar6 = (bool)((byte)(uVar42 >> 3) & 1);
        auVar67._12_4_ = (float)((uint)bVar6 * auVar66._12_4_ | (uint)!bVar6 * auVar61._12_4_);
        bVar6 = (bool)((byte)(uVar42 >> 4) & 1);
        auVar67._16_4_ = (float)((uint)bVar6 * auVar66._16_4_ | (uint)!bVar6 * auVar61._16_4_);
        bVar6 = (bool)((byte)(uVar42 >> 5) & 1);
        auVar67._20_4_ = (float)((uint)bVar6 * auVar66._20_4_ | (uint)!bVar6 * auVar61._20_4_);
        bVar6 = (bool)((byte)(uVar42 >> 6) & 1);
        auVar67._24_4_ = (float)((uint)bVar6 * auVar66._24_4_ | (uint)!bVar6 * auVar61._24_4_);
        bVar6 = SUB81(uVar42 >> 7,0);
        auVar67._28_4_ = (float)((uint)bVar6 * auVar66._28_4_ | (uint)!bVar6 * auVar61._28_4_);
        auVar60 = vfmsub231ps_fma(auVar62,auVar67,auVar74);
        auVar60 = vfnmsub231ps_fma(ZEXT1632(auVar60),auVar67,auVar77);
        auVar62 = ZEXT1632(auVar60);
        auVar32._28_4_ = auVar63._28_4_;
        auVar32._0_28_ =
             ZEXT1628(CONCAT412(auVar60._12_4_ * auVar60._12_4_,
                                CONCAT48(auVar60._8_4_ * auVar60._8_4_,
                                         CONCAT44(auVar60._4_4_ * auVar60._4_4_,
                                                  auVar60._0_4_ * auVar60._0_4_))));
        auVar75._8_4_ = 0x39506967;
        auVar75._0_8_ = 0x3950696739506967;
        auVar75._12_4_ = 0x39506967;
        auVar75._16_4_ = 0x39506967;
        auVar75._20_4_ = 0x39506967;
        auVar75._24_4_ = 0x39506967;
        auVar75._28_4_ = 0x39506967;
        auVar24._8_4_ = 0x3ab743ce;
        auVar24._0_8_ = 0x3ab743ce3ab743ce;
        auVar24._12_4_ = 0x3ab743ce;
        auVar24._16_4_ = 0x3ab743ce;
        auVar24._20_4_ = 0x3ab743ce;
        auVar24._24_4_ = 0x3ab743ce;
        auVar24._28_4_ = 0x3ab743ce;
        auVar61 = vfmadd213ps_avx512vl(auVar75,auVar62,auVar24);
        auVar25._8_4_ = 0x3c088908;
        auVar25._0_8_ = 0x3c0889083c088908;
        auVar25._12_4_ = 0x3c088908;
        auVar25._16_4_ = 0x3c088908;
        auVar25._20_4_ = 0x3c088908;
        auVar25._24_4_ = 0x3c088908;
        auVar25._28_4_ = 0x3c088908;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar62,auVar25);
        auVar26._8_4_ = 0x3d2aa9c1;
        auVar26._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar26._12_4_ = 0x3d2aa9c1;
        auVar26._16_4_ = 0x3d2aa9c1;
        auVar26._20_4_ = 0x3d2aa9c1;
        auVar26._24_4_ = 0x3d2aa9c1;
        auVar26._28_4_ = 0x3d2aa9c1;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar62,auVar26);
        auVar27._8_4_ = 0x3e2aaaaa;
        auVar27._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar27._12_4_ = 0x3e2aaaaa;
        auVar27._16_4_ = 0x3e2aaaaa;
        auVar27._20_4_ = 0x3e2aaaaa;
        auVar27._24_4_ = 0x3e2aaaaa;
        auVar27._28_4_ = 0x3e2aaaaa;
        auVar62 = ZEXT1632(auVar60);
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar62,auVar27);
        auVar60 = vfmadd213ps_fma(auVar61,auVar62,auVar78);
        auVar60 = vfmadd213ps_fma(ZEXT1632(auVar60),auVar32,auVar62);
        auVar70._0_4_ = (int)auVar67._0_4_;
        auVar70._4_4_ = (int)auVar67._4_4_;
        auVar70._8_4_ = (int)auVar67._8_4_;
        auVar70._12_4_ = (int)auVar67._12_4_;
        auVar70._16_4_ = (int)auVar67._16_4_;
        auVar70._20_4_ = (int)auVar67._20_4_;
        auVar70._24_4_ = (int)auVar67._24_4_;
        auVar70._28_4_ = (int)auVar67._28_4_;
        auVar61 = vpslld_avx2(auVar70,0x17);
        auVar28._8_4_ = 0x3f800000;
        auVar28._0_8_ = 0x3f8000003f800000;
        auVar28._12_4_ = 0x3f800000;
        auVar28._16_4_ = 0x3f800000;
        auVar28._20_4_ = 0x3f800000;
        auVar28._24_4_ = 0x3f800000;
        auVar28._28_4_ = 0x3f800000;
        auVar61 = vpaddd_avx512vl(auVar61,auVar28);
        auVar33._4_4_ = auVar61._4_4_ * *(float *)((long)*pauVar48 + 4);
        auVar33._0_4_ = auVar61._0_4_ * *(float *)*pauVar48;
        auVar33._8_4_ = auVar61._8_4_ * *(float *)((long)*pauVar48 + 8);
        auVar33._12_4_ = auVar61._12_4_ * *(float *)((long)*pauVar48 + 0xc);
        auVar33._16_4_ = auVar61._16_4_ * *(float *)((long)*pauVar48 + 0x10);
        auVar33._20_4_ = auVar61._20_4_ * *(float *)((long)*pauVar48 + 0x14);
        auVar33._24_4_ = auVar61._24_4_ * *(float *)((long)*pauVar48 + 0x18);
        auVar33._28_4_ = auVar61._28_4_;
        auVar60 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar60),auVar33);
        *pauVar48 = ZEXT1632(auVar60);
        ppp_Var45 = ppp_Var45 + 4;
        pauVar48 = pauVar48 + 1;
        lVar46 = lVar46 + 8;
      }
      lVar50 = sVar3 * sVar2 * (long)pMVar36;
      lVar44 = local_188.cstep * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
      for (; (int)lVar46 < iVar53; lVar46 = lVar46 + 1) {
        auVar60 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)(_func_int ***)pvVar56 +
                                                   lVar46 * 4 + lVar44 * (long)pMVar36)),local_128,
                                  ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var37[-3])));
        auVar59._8_4_ = 0x80000000;
        auVar59._0_8_ = 0x8000000080000000;
        auVar59._12_4_ = 0x80000000;
        auVar59 = vxorps_avx512vl(ZEXT416(*(uint *)(&this->field_0xdc + (long)pp_Var37[-3])),auVar59
                                 );
        fVar68 = powf(auVar60._0_4_,auVar59._0_4_);
        *(float *)((long)pvVar5 + lVar46 * 4 + lVar50) =
             fVar68 * *(float *)((long)pvVar5 + lVar46 * 4 + lVar50);
      }
      uVar54 = (uint)local_138;
    }
    piVar34 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_188.allocator == (Allocator *)0x0) goto LAB_003093e1;
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    iVar53 = 0;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var37[-3]) != 1) goto LAB_003093ee;
    piVar34 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
    local_188.data = local_118.data;
    local_188.refcount._0_4_ = (int)local_118.refcount;
    local_188.refcount._4_4_ = local_118.refcount._4_4_;
    local_188.elemsize._0_4_ = (undefined4)local_118.elemsize;
    local_188.elemsize._4_4_ = (undefined4)(local_118.elemsize >> 0x20);
    local_188.elempack = local_118.elempack;
    local_188.allocator = local_118.allocator;
    local_188.dims = local_118.dims;
    local_188.w = local_118.w;
    local_188.h = local_118.h;
    local_188.d = local_118.d;
    local_188.c = local_118.c;
    local_188.cstep = local_118.cstep;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
      pp_Var37 = this->_vptr_LRN_x86_avx512;
    }
    p_Var40 = pp_Var37[-3];
    uVar54 = *(uint *)(&this->field_0xd4 + (long)p_Var40);
    uVar57 = uVar39;
    if (1 < (int)uVar54) {
      uVar54 = uVar54 >> 1;
      stack0xffffffffffffff98 = SUB6448(*opt,0x10);
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = SUB648(*opt,0);
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar53 = ~uVar54 + *(int *)(&this->field_0xd4 + (long)pp_Var37[-3]);
      copy_make_border(&local_118,&local_188,uVar54,iVar53,uVar54,iVar53,0,0.0,(Option *)&_space_ofs
                      );
      iVar53 = -100;
      if (((Allocator *)local_188.data == (Allocator *)0x0) ||
         ((long)local_188.c * local_188.cstep == 0)) {
        piVar34 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
        if (piVar34 == (int *)0x0) goto LAB_003093ee;
        LOCK();
        *piVar34 = *piVar34 + -1;
        UNLOCK();
        if (*piVar34 != 0) goto LAB_003093ee;
        if (local_188.allocator != (Allocator *)0x0) {
          (*(local_188.allocator)->_vptr_Allocator[3])();
          goto LAB_003093ee;
        }
        goto LAB_00309442;
      }
      p_Var40 = this->_vptr_LRN_x86_avx512[-3];
      uVar54 = *(uint *)(&this->field_0xd4 + (long)p_Var40);
      uVar57 = local_188.w;
    }
    uVar54 = uVar54 * uVar54;
    local_128._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var40);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar54,&local_199);
    piVar35 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var37 = this->_vptr_LRN_x86_avx512;
    iVar53 = *(int *)(&this->field_0xd4 + (long)pp_Var37[-3]);
    iVar58 = uVar57 - iVar53;
    lVar46 = 0;
    iVar55 = 0;
    for (iVar47 = 0; iVar47 < iVar53; iVar47 = iVar47 + 1) {
      for (lVar50 = 0; iVar49 = (int)lVar50, iVar49 < iVar53; lVar50 = lVar50 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar46 + lVar50] = iVar55 + iVar49;
        iVar53 = *(int *)(&this->field_0xd4 + (long)pp_Var37[-3]);
      }
      iVar55 = iVar55 + iVar58 + iVar49;
      lVar46 = (int)lVar46 + lVar50;
    }
    local_b8 = bottom_top_blob->data;
    local_c0 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
    local_c8 = local_188.cstep * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
    local_a8 = (long)local_188.w * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize)
    ;
    pMVar41 = (Mat *)0x0;
    pMVar36 = (Mat *)(ulong)uVar39;
    if ((int)uVar39 < 1) {
      pMVar36 = pMVar41;
    }
    local_d0 = (Allocator *)local_188.data;
    iVar53 = (int)local_198;
    local_198 = (Mat *)((ulong)local_198 & 0xffffffff);
    if (iVar53 < 1) {
      local_198 = pMVar41;
    }
    local_98._0_4_ = 1.0 / (float)(int)uVar54;
    while (pMVar41 != local_140) {
      pvVar56 = (void *)(local_c0 * (long)pMVar41 + (long)local_b8);
      local_138 = (_func_int ***)((long)&local_d0->_vptr_Allocator + local_c8 * (long)pMVar41);
      pMVar38 = (Mat *)0x0;
      local_b0 = pMVar41;
      while (ppp_Var45 = local_138, pMVar38 != local_198) {
        lVar46 = local_a8 * (long)pMVar38;
        pp_Var37 = this->_vptr_LRN_x86_avx512;
        local_130 = pMVar38;
        for (pMVar41 = (Mat *)0x0; pMVar41 != pMVar36; pMVar41 = (Mat *)((long)&pMVar41->data + 1))
        {
          fVar68 = 0.0;
          for (uVar42 = 0; uVar54 != uVar42; uVar42 = uVar42 + 1) {
            fVar68 = fVar68 + *(float *)((long)ppp_Var45 +
                                        (long)piVar35[uVar42] * 4 + (long)pMVar41 * 4 + lVar46);
          }
          auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar68 * (float)local_128._0_4_)),
                                    ZEXT416((uint)local_98._0_4_),
                                    ZEXT416(*(uint *)(&local_190->field_0xe0 + (long)pp_Var37[-3])))
          ;
          auVar10._8_4_ = 0x80000000;
          auVar10._0_8_ = 0x8000000080000000;
          auVar10._12_4_ = 0x80000000;
          auVar59 = vxorps_avx512vl(ZEXT416(*(uint *)(&local_190->field_0xdc + (long)pp_Var37[-3])),
                                    auVar10);
          fVar68 = powf(auVar60._0_4_,auVar59._0_4_);
          *(float *)((long)pvVar56 + (long)pMVar41 * 4) =
               fVar68 * *(float *)((long)pvVar56 + (long)pMVar41 * 4);
        }
        pvVar56 = (void *)((long)pvVar56 + local_a0 * 4);
        this = local_190;
        pMVar38 = (Mat *)((long)&local_130->data + 1);
      }
      pMVar41 = (Mat *)((long)&local_b0->data + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    piVar34 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
LAB_003093e1:
          free(local_188.data);
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar53 = 0;
LAB_003093ee:
  piVar34 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar53;
}

Assistant:

int LRN_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}